

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>::
operator()(ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
           *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImVec2 IVar1;
  double dVar2;
  GetterYs<float> *pGVar3;
  TransformerLogLin *pTVar4;
  ImPlotPlot *pIVar5;
  GetterYRef *pGVar6;
  ImDrawVert *pIVar7;
  ImDrawIdx *pIVar8;
  double dVar9;
  undefined1 auVar10 [12];
  ImPlotContext *pIVar11;
  ImPlotContext *pIVar12;
  int iVar13;
  ushort uVar14;
  ImDrawIdx IVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  double dVar21;
  ImVec2 IVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  undefined1 auVar37 [16];
  
  pIVar11 = GImPlot;
  pGVar3 = this->Getter1;
  dVar9 = (double)(prim + 1);
  pTVar4 = this->Transformer;
  iVar13 = pGVar3->Count;
  fVar27 = *(float *)((long)pGVar3->Ys +
                     (long)(((prim + 1 + pGVar3->Offset) % iVar13 + iVar13) % iVar13) *
                     (long)pGVar3->Stride);
  dVar21 = log10((pGVar3->XScale * dVar9 + pGVar3->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar12 = GImPlot;
  pIVar5 = pIVar11->CurrentPlot;
  dVar2 = (pIVar5->XAxis).Range.Min;
  iVar13 = pTVar4->YAxis;
  pGVar6 = this->Getter2;
  pTVar4 = this->Transformer;
  IVar1 = pIVar11->PixelRange[iVar13].Min;
  fVar23 = (float)(pIVar11->Mx *
                   (((double)(float)(dVar21 / pIVar11->LogDenX) *
                     ((pIVar5->XAxis).Range.Max - dVar2) + dVar2) - dVar2) + (double)IVar1.x);
  fVar25 = (float)(pIVar11->My[iVar13] * ((double)fVar27 - pIVar5->YAxis[iVar13].Range.Min) +
                  (double)IVar1.y);
  dVar2 = pGVar6->YRef;
  dVar21 = log10((dVar9 * pGVar6->XScale + pGVar6->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar5 = pIVar12->CurrentPlot;
  dVar9 = (pIVar5->XAxis).Range.Min;
  iVar13 = pTVar4->YAxis;
  IVar1 = pIVar12->PixelRange[iVar13].Min;
  IVar22.x = (float)(pIVar12->Mx *
                     (((double)(float)(dVar21 / pIVar12->LogDenX) *
                       ((pIVar5->XAxis).Range.Max - dVar9) + dVar9) - dVar9) + (double)IVar1.x);
  IVar22.y = (float)(pIVar12->My[iVar13] * (dVar2 - pIVar5->YAxis[iVar13].Range.Min) +
                    (double)IVar1.y);
  fVar24 = (this->P12).x;
  fVar26 = (this->P12).y;
  fVar28 = (this->P11).y;
  fVar33 = (this->P11).x;
  uVar19 = -(uint)(fVar28 < fVar26);
  fVar27 = (float)(~-(uint)(fVar24 <= fVar33) & (uint)fVar24 |
                  (uint)fVar33 & -(uint)(fVar24 <= fVar33));
  fVar29 = (float)(~-(uint)(fVar26 <= fVar28) & (uint)fVar26 |
                  (uint)fVar28 & -(uint)(fVar26 <= fVar28));
  fVar32 = (float)(~-(uint)(fVar33 < fVar24) & (uint)fVar24 |
                  (uint)fVar33 & -(uint)(fVar33 < fVar24));
  fVar41 = (float)(~uVar19 & (uint)fVar26 | (uint)fVar28 & uVar19);
  uVar16 = -(uint)(fVar23 <= fVar27);
  uVar17 = -(uint)(fVar25 <= fVar29);
  uVar18 = -(uint)(fVar32 < fVar23);
  uVar20 = -(uint)(fVar41 < fVar25);
  fVar27 = (float)(~uVar16 & (uint)fVar23 | (uint)fVar27 & uVar16);
  fVar29 = (float)(~uVar17 & (uint)fVar25 | (uint)fVar29 & uVar17);
  fVar32 = (float)(~uVar18 & (uint)fVar23 | (uint)fVar32 & uVar18);
  fVar41 = (float)(~uVar20 & (uint)fVar25 | (uint)fVar41 & uVar20);
  uVar16 = -(uint)(IVar22.x <= fVar27);
  uVar17 = -(uint)(IVar22.y <= fVar29);
  uVar18 = -(uint)(fVar32 < IVar22.x);
  uVar20 = -(uint)(fVar41 < IVar22.y);
  auVar31._0_4_ = (uint)fVar27 & uVar16;
  auVar31._4_4_ = (uint)fVar29 & uVar17;
  auVar31._8_4_ = (uint)fVar32 & uVar18;
  auVar31._12_4_ = (uint)fVar41 & uVar20;
  auVar38._0_4_ = ~uVar16 & (uint)IVar22.x;
  auVar38._4_4_ = ~uVar17 & (uint)IVar22.y;
  auVar38._8_4_ = ~uVar18 & (uint)IVar22.x;
  auVar38._12_4_ = ~uVar20 & (uint)IVar22.y;
  auVar38 = auVar38 | auVar31;
  fVar27 = (cull_rect->Min).y;
  auVar40._4_4_ = -(uint)(fVar27 < auVar38._4_4_);
  auVar40._0_4_ = -(uint)((cull_rect->Min).x < auVar38._0_4_);
  auVar10._4_8_ = auVar38._8_8_;
  auVar10._0_4_ = -(uint)(auVar38._4_4_ < fVar27);
  auVar39._0_8_ = auVar10._0_8_ << 0x20;
  auVar39._8_4_ = -(uint)(auVar38._8_4_ < (cull_rect->Max).x);
  auVar39._12_4_ = -(uint)(auVar38._12_4_ < (cull_rect->Max).y);
  auVar40._8_8_ = auVar39._8_8_;
  iVar13 = movmskps((int)cull_rect,auVar40);
  if (iVar13 == 0xf) {
    fVar29 = fVar25 * fVar33 - fVar28 * fVar23;
    fVar32 = IVar22.y * fVar24 - fVar26 * IVar22.x;
    fVar27 = fVar26 - IVar22.y;
    auVar34._4_4_ = fVar27;
    auVar34._0_4_ = fVar27;
    auVar34._8_4_ = fVar27;
    auVar34._12_4_ = fVar27;
    auVar35._4_12_ = auVar34._4_12_;
    auVar35._0_4_ = fVar27 * (fVar33 - fVar23) - (fVar28 - fVar25) * (fVar24 - IVar22.x);
    auVar30._0_4_ = fVar29 * (fVar24 - IVar22.x) - fVar32 * (fVar33 - fVar23);
    auVar30._4_4_ = fVar29 * fVar27 - fVar32 * (fVar28 - fVar25);
    auVar30._8_4_ = fVar25 * 0.0 - IVar22.y * 0.0;
    auVar30._12_4_ = fVar25 * 0.0 - IVar22.y * 0.0;
    auVar37._0_8_ = auVar35._0_8_;
    auVar37._8_4_ = fVar27;
    auVar37._12_4_ = fVar27;
    auVar36._8_8_ = auVar37._8_8_;
    auVar36._4_4_ = auVar35._0_4_;
    auVar36._0_4_ = auVar35._0_4_;
    auVar31 = divps(auVar30,auVar36);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7->col = this->Col;
    pIVar7[1].pos.x = fVar23;
    pIVar7[1].pos.y = fVar25;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[1].col = this->Col;
    pIVar7[2].pos = auVar31._0_8_;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[2].col = this->Col;
    pIVar7[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[3].col = this->Col;
    pIVar7[4].pos = IVar22;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar7 + 5;
    uVar16 = DrawList->_VtxCurrentIdx;
    pIVar8 = DrawList->_IdxWritePtr;
    IVar15 = (ImDrawIdx)uVar16;
    *pIVar8 = IVar15;
    uVar14 = (byte)((byte)uVar19 & IVar22.y < fVar25 | -(fVar26 < fVar28) & -(fVar25 < IVar22.y)) &
             1;
    pIVar8[1] = IVar15 + uVar14 + 1;
    pIVar8[2] = IVar15 + 3;
    pIVar8[3] = IVar15 + 1;
    pIVar8[4] = (uVar14 ^ 3) + IVar15;
    pIVar8[5] = IVar15 + 4;
    DrawList->_IdxWritePtr = pIVar8 + 6;
    DrawList->_VtxCurrentIdx = uVar16 + 5;
  }
  (this->P11).x = fVar23;
  (this->P11).y = fVar25;
  (this->P12).x = IVar22.x;
  (this->P12).y = IVar22.y;
  return (char)iVar13 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }